

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.cpp
# Opt level: O1

void __thiscall
Centaurus::ATNNode<unsigned_char>::parse_literal(ATNNode<unsigned_char> *this,Stream *stream)

{
  wchar_t wVar1;
  wchar_t ch;
  StreamException *__return_storage_ptr__;
  bool bVar2;
  
  wVar1 = Stream::get(stream);
  ch = Stream::get(stream);
  bVar2 = ch != wVar1;
  if (bVar2 && ch != L'\0') {
    do {
      std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      push_back(&this->m_literal,(uchar)ch);
      ch = Stream::get(stream);
      bVar2 = ch != wVar1;
      if (ch == L'\0') break;
    } while (ch != wVar1);
  }
  if (!bVar2) {
    return;
  }
  __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
  Stream::unexpected(__return_storage_ptr__,stream,ch);
  __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,StreamException::~StreamException);
}

Assistant:

void ATNNode<TCHAR>::parse_literal(Stream& stream)
{
    wchar_t leader = stream.get();

    wchar_t ch = stream.get();

    for (; ch != L'\0' && ch != leader; ch = stream.get())
    {
        m_literal.push_back(wide_to_target<TCHAR>(ch));
    }

    if (leader != ch)
        throw stream.unexpected(ch);
}